

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O2

QcList * qc_list_create(int with_rwlock)

{
  QcList *__ptr;
  QcRWLock *pQVar1;
  
  __ptr = (QcList *)calloc(1,0x28);
  if (__ptr != (QcList *)0x0) {
    if (with_rwlock != 0) {
      pQVar1 = qc_thread_rwlock_create();
      __ptr->rwlock = pQVar1;
      if (pQVar1 == (QcRWLock *)0x0) {
        free(__ptr);
        __ptr = (QcList *)0x0;
      }
    }
    return __ptr;
  }
  fprintf(_stderr,"malloc failed. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
          ,0x1a3);
  __assert_fail("list",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
                ,0x1a3,"QcList *qc_list_create(int)");
}

Assistant:

QcList *qc_list_create(int with_rwlock)
{       
    QcList *list;

    qc_malloc(list, sizeof(struct __QcList));
    if(NULL == list)
    {
        return NULL;
    }

    list->head = NULL;
    list->tail = NULL;
    list->cur  = NULL;
    list->count = 0;
    list->rwlock = NULL;

    if(with_rwlock)
    {
        list->rwlock = qc_thread_rwlock_create();
        if(NULL == list->rwlock)
        {
            qc_free(list);
            return NULL;
        }
    }

    return list;
}